

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O1

void __thiscall
sglr::ReferenceContext::bindTexture(ReferenceContext *this,deUint32 target,deUint32 texture)

{
  ObjectManager<sglr::rc::Texture> *this_00;
  int unitNdx;
  Type TVar1;
  Texture3D *object;
  TextureCubeArray *object_00;
  Texture1D *object_01;
  Texture2D *object_02;
  Texture2DArray *object_03;
  Type TVar2;
  TextureCube *pTVar3;
  uint uVar4;
  pair<unsigned_int,_sglr::rc::Texture_*> local_40;
  
  unitNdx = this->m_activeTexture;
  if ((int)target < 0x8513) {
    if ((1 < target - 0xde0) && (target != 0x806f)) goto LAB_018d3aa9;
  }
  else if (((target != 0x8513) && (target != 0x8c1a)) && (target != 0x9009)) goto LAB_018d3aa9;
  if ((target != 0xde0) || (((this->m_limits).contextType.super_ApiType.m_bits & 0x300) != 0)) {
    if (texture != 0) {
      this_00 = &this->m_textures;
      pTVar3 = (TextureCube *)rc::ObjectManager<sglr::rc::Texture>::find(this_00,texture);
      if (pTVar3 == (TextureCube *)0x0) {
        uVar4 = target & 0xffff;
        pTVar3 = (TextureCube *)0x0;
        if (uVar4 < 0x8513) {
          if (uVar4 == 0xde0) {
            pTVar3 = (TextureCube *)operator_new(0x5b0);
            rc::Texture1D::Texture1D((Texture1D *)pTVar3,texture);
          }
          else if (uVar4 == 0xde1) {
            pTVar3 = (TextureCube *)operator_new(0x5b0);
            rc::Texture2D::Texture2D((Texture2D *)pTVar3,texture);
          }
          else {
            pTVar3 = (TextureCube *)0x0;
            if (uVar4 == 0x806f) {
              pTVar3 = (TextureCube *)operator_new(0x5b0);
              rc::Texture3D::Texture3D((Texture3D *)pTVar3,texture);
            }
          }
        }
        else if (uVar4 == 0x8513) {
          pTVar3 = (TextureCube *)operator_new(0x2018);
          rc::TextureCube::TextureCube(pTVar3,texture);
        }
        else if (uVar4 == 0x8c1a) {
          pTVar3 = (TextureCube *)operator_new(0x5b0);
          rc::Texture2DArray::Texture2DArray((Texture2DArray *)pTVar3,texture);
        }
        else if (uVar4 == 0x9009) {
          pTVar3 = (TextureCube *)operator_new(0x5b0);
          rc::TextureCubeArray::TextureCubeArray((TextureCubeArray *)pTVar3,texture);
        }
        local_40.first = (pTVar3->super_Texture).super_NamedObject.m_name;
        if (this_00->m_lastName < local_40.first) {
          this_00->m_lastName = local_40.first;
        }
        local_40.second = &pTVar3->super_Texture;
        std::
        _Rb_tree<unsigned_int,std::pair<unsigned_int_const,sglr::rc::Texture*>,std::_Select1st<std::pair<unsigned_int_const,sglr::rc::Texture*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,sglr::rc::Texture*>>>
        ::_M_emplace_unique<std::pair<unsigned_int,sglr::rc::Texture*>>
                  ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,sglr::rc::Texture*>,std::_Select1st<std::pair<unsigned_int_const,sglr::rc::Texture*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,sglr::rc::Texture*>>>
                    *)&(this->m_textures).m_objects,&local_40);
      }
      else {
        uVar4 = target & 0xffff;
        TVar2 = TYPE_LAST;
        if (uVar4 < 0x8513) {
          if (uVar4 == 0xde0) {
            TVar2 = TYPE_1D;
          }
          else if (uVar4 == 0xde1) {
            TVar2 = TYPE_2D;
          }
          else if (uVar4 == 0x806f) {
            TVar2 = TYPE_3D;
          }
        }
        else if (uVar4 == 0x8513) {
          TVar2 = TYPE_CUBE_MAP;
        }
        else if (uVar4 == 0x8c1a) {
          TVar2 = TYPE_2D_ARRAY;
        }
        else if (uVar4 == 0x9009) {
          TVar2 = TYPE_CUBE_MAP_ARRAY;
        }
        TVar1 = (pTVar3->super_Texture).m_type;
        if (TVar1 != TVar2) {
          if (this->m_lastError == 0) {
            this->m_lastError = 0x502;
          }
          if (TVar1 != TVar2) {
            return;
          }
        }
      }
      uVar4 = target & 0xffff;
      if (uVar4 < 0x8513) {
        if (uVar4 == 0xde0) {
          setTex1DBinding(this,unitNdx,(Texture1D *)pTVar3);
          return;
        }
        if (uVar4 != 0xde1) {
          if (uVar4 != 0x806f) {
            return;
          }
          setTex3DBinding(this,unitNdx,(Texture3D *)pTVar3);
          return;
        }
        setTex2DBinding(this,unitNdx,(Texture2D *)pTVar3);
        return;
      }
      if (uVar4 == 0x8513) {
        setTexCubeBinding(this,unitNdx,pTVar3);
        return;
      }
      if (uVar4 != 0x8c1a) {
        if (uVar4 != 0x9009) {
          return;
        }
        setTexCubeArrayBinding(this,unitNdx,(TextureCubeArray *)pTVar3);
        return;
      }
      setTex2DArrayBinding(this,unitNdx,(Texture2DArray *)pTVar3);
      return;
    }
    uVar4 = target & 0xffff;
    if (uVar4 < 0x8513) {
      if (uVar4 == 0xde0) {
        object_01 = (this->m_textureUnits).
                    super__Vector_base<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
                    ._M_impl.super__Vector_impl_data._M_start[unitNdx].tex1DBinding;
        if (object_01 == (Texture1D *)0x0) {
          return;
        }
        rc::ObjectManager<sglr::rc::Texture>::releaseReference
                  (&this->m_textures,&object_01->super_Texture);
        (this->m_textureUnits).
        super__Vector_base<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
        ._M_impl.super__Vector_impl_data._M_start[unitNdx].tex1DBinding = (Texture1D *)0x0;
        return;
      }
      if (uVar4 == 0xde1) {
        object_02 = (this->m_textureUnits).
                    super__Vector_base<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
                    ._M_impl.super__Vector_impl_data._M_start[unitNdx].tex2DBinding;
        if (object_02 == (Texture2D *)0x0) {
          return;
        }
        rc::ObjectManager<sglr::rc::Texture>::releaseReference
                  (&this->m_textures,&object_02->super_Texture);
        (this->m_textureUnits).
        super__Vector_base<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
        ._M_impl.super__Vector_impl_data._M_start[unitNdx].tex2DBinding = (Texture2D *)0x0;
        return;
      }
      if (uVar4 != 0x806f) {
        return;
      }
      object = (this->m_textureUnits).
               super__Vector_base<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
               ._M_impl.super__Vector_impl_data._M_start[unitNdx].tex3DBinding;
      if (object == (Texture3D *)0x0) {
        return;
      }
      rc::ObjectManager<sglr::rc::Texture>::releaseReference
                (&this->m_textures,&object->super_Texture);
      (this->m_textureUnits).
      super__Vector_base<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
      ._M_impl.super__Vector_impl_data._M_start[unitNdx].tex3DBinding = (Texture3D *)0x0;
      return;
    }
    if (uVar4 == 0x8513) {
      pTVar3 = (this->m_textureUnits).
               super__Vector_base<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
               ._M_impl.super__Vector_impl_data._M_start[unitNdx].texCubeBinding;
      if (pTVar3 == (TextureCube *)0x0) {
        return;
      }
      rc::ObjectManager<sglr::rc::Texture>::releaseReference
                (&this->m_textures,&pTVar3->super_Texture);
      (this->m_textureUnits).
      super__Vector_base<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
      ._M_impl.super__Vector_impl_data._M_start[unitNdx].texCubeBinding = (TextureCube *)0x0;
      return;
    }
    if (uVar4 == 0x8c1a) {
      object_03 = (this->m_textureUnits).
                  super__Vector_base<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
                  ._M_impl.super__Vector_impl_data._M_start[unitNdx].tex2DArrayBinding;
      if (object_03 == (Texture2DArray *)0x0) {
        return;
      }
      rc::ObjectManager<sglr::rc::Texture>::releaseReference
                (&this->m_textures,&object_03->super_Texture);
      (this->m_textureUnits).
      super__Vector_base<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
      ._M_impl.super__Vector_impl_data._M_start[unitNdx].tex2DArrayBinding = (Texture2DArray *)0x0;
      return;
    }
    if (uVar4 != 0x9009) {
      return;
    }
    object_00 = (this->m_textureUnits).
                super__Vector_base<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
                ._M_impl.super__Vector_impl_data._M_start[unitNdx].texCubeArrayBinding;
    if (object_00 == (TextureCubeArray *)0x0) {
      return;
    }
    rc::ObjectManager<sglr::rc::Texture>::releaseReference
              (&this->m_textures,&object_00->super_Texture);
    (this->m_textureUnits).
    super__Vector_base<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
    ._M_impl.super__Vector_impl_data._M_start[unitNdx].texCubeArrayBinding = (TextureCubeArray *)0x0
    ;
    return;
  }
LAB_018d3aa9:
  if (this->m_lastError == 0) {
    this->m_lastError = 0x500;
  }
  return;
}

Assistant:

void ReferenceContext::bindTexture (deUint32 target, deUint32 texture)
{
	int unitNdx = m_activeTexture;

	RC_IF_ERROR(target != GL_TEXTURE_1D				&&
				target != GL_TEXTURE_2D				&&
				target != GL_TEXTURE_CUBE_MAP		&&
				target != GL_TEXTURE_2D_ARRAY		&&
				target != GL_TEXTURE_3D				&&
				target != GL_TEXTURE_CUBE_MAP_ARRAY,
				GL_INVALID_ENUM, RC_RET_VOID);

	RC_IF_ERROR(glu::isContextTypeES(m_limits.contextType) && (target == GL_TEXTURE_1D), GL_INVALID_ENUM, RC_RET_VOID);

	if (texture == 0)
	{
		// Clear binding.
		switch (target)
		{
			case GL_TEXTURE_1D:				setTex1DBinding			(unitNdx, DE_NULL);	break;
			case GL_TEXTURE_2D:				setTex2DBinding			(unitNdx, DE_NULL);	break;
			case GL_TEXTURE_CUBE_MAP:		setTexCubeBinding		(unitNdx, DE_NULL);	break;
			case GL_TEXTURE_2D_ARRAY:		setTex2DArrayBinding	(unitNdx, DE_NULL);	break;
			case GL_TEXTURE_3D:				setTex3DBinding			(unitNdx, DE_NULL);	break;
			case GL_TEXTURE_CUBE_MAP_ARRAY:	setTexCubeArrayBinding	(unitNdx, DE_NULL);	break;
			default:
				DE_ASSERT(false);
		}
	}
	else
	{
		Texture* texObj = m_textures.find(texture);

		if (texObj)
		{
			// Validate type.
			Texture::Type expectedType = Texture::TYPE_LAST;
			switch (target)
			{
				case GL_TEXTURE_1D:				expectedType = Texture::TYPE_1D;				break;
				case GL_TEXTURE_2D:				expectedType = Texture::TYPE_2D;				break;
				case GL_TEXTURE_CUBE_MAP:		expectedType = Texture::TYPE_CUBE_MAP;			break;
				case GL_TEXTURE_2D_ARRAY:		expectedType = Texture::TYPE_2D_ARRAY;			break;
				case GL_TEXTURE_3D:				expectedType = Texture::TYPE_3D;				break;
				case GL_TEXTURE_CUBE_MAP_ARRAY:	expectedType = Texture::TYPE_CUBE_MAP_ARRAY;	break;
				default:
					DE_ASSERT(false);
			}
			RC_IF_ERROR(texObj->getType() != expectedType, GL_INVALID_OPERATION, RC_RET_VOID);
		}
		else
		{
			// New texture object.
			switch (target)
			{
				case GL_TEXTURE_1D:				texObj = new Texture1D			(texture);	break;
				case GL_TEXTURE_2D:				texObj = new Texture2D			(texture);	break;
				case GL_TEXTURE_CUBE_MAP:		texObj = new TextureCube		(texture);	break;
				case GL_TEXTURE_2D_ARRAY:		texObj = new Texture2DArray		(texture);	break;
				case GL_TEXTURE_3D:				texObj = new Texture3D			(texture);	break;
				case GL_TEXTURE_CUBE_MAP_ARRAY:	texObj = new TextureCubeArray	(texture);	break;
				default:
					DE_ASSERT(false);
			}

			m_textures.insert(texObj);
		}

		switch (target)
		{
			case GL_TEXTURE_1D:				setTex1DBinding			(unitNdx, static_cast<Texture1D*>			(texObj));	break;
			case GL_TEXTURE_2D:				setTex2DBinding			(unitNdx, static_cast<Texture2D*>			(texObj));	break;
			case GL_TEXTURE_CUBE_MAP:		setTexCubeBinding		(unitNdx, static_cast<TextureCube*>			(texObj));	break;
			case GL_TEXTURE_2D_ARRAY:		setTex2DArrayBinding	(unitNdx, static_cast<Texture2DArray*>		(texObj));	break;
			case GL_TEXTURE_3D:				setTex3DBinding			(unitNdx, static_cast<Texture3D*>			(texObj));	break;
			case GL_TEXTURE_CUBE_MAP_ARRAY:	setTexCubeArrayBinding	(unitNdx, static_cast<TextureCubeArray*>	(texObj));	break;
			default:
				DE_ASSERT(false);
		}
	}
}